

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkMarkCone_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vFlops)

{
  ushort uVar1;
  uint uVar2;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = *(ushort *)pObj;
  if (-1 < (char)uVar1) {
    *(ushort *)pObj = uVar1 | 0x80;
    if ((uVar1 & 0x3d) == 1) {
      if ((uVar1 & 3) != 1) {
        Vec_IntPush(vFlops,(pObj->field_10).Fanins[1]);
        return;
      }
    }
    else {
      uVar4 = (ulong)pObj->nFanins;
      if (0 < (int)pObj->nFanins) {
        lVar5 = 0;
        do {
          if ((2 < (uint)uVar4) ||
             (paVar3 = &pObj->field_10,
             (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) ==
             (undefined1  [24])0x6)) {
            paVar3 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
          }
          uVar2 = paVar3->Fanins[lVar5];
          if ((ulong)uVar2 != 0) {
            if (((int)uVar2 < 1) || (p->nObjsAlloc <= (int)uVar2)) {
              __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                            ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
            }
            Wlc_NtkMarkCone_rec(p,p->pObjs + uVar2,vFlops);
          }
          lVar5 = lVar5 + 1;
          uVar4 = (ulong)(int)pObj->nFanins;
        } while (lVar5 < (long)uVar4);
      }
    }
  }
  return;
}

Assistant:

void Wlc_NtkMarkCone_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vFlops )
{
    int i, iFanin;
    if ( pObj->Mark )
        return;
    pObj->Mark = 1;
    if ( Wlc_ObjIsCi(pObj) )
    {
        if ( !Wlc_ObjIsPi(pObj) )
            Vec_IntPush( vFlops, Wlc_ObjCiId(pObj) );
        return;
    }
    Wlc_ObjForEachFanin( pObj, iFanin, i ) if ( iFanin )
        Wlc_NtkMarkCone_rec( p, Wlc_NtkObj(p, iFanin), vFlops );
}